

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  
  allocate(this,nrow,ncol);
  uVar1 = this->nrow_;
  uVar2 = this->ncol_;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    ppdVar3 = this->data_;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      ppdVar3[uVar4][uVar5] = 0.0;
    }
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol) {
      allocate(nrow, ncol);

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = 0.0;
    }